

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::transposeTransitionMatrices
          (BeagleCPUImpl<double,_1,_1> *this,int *inputIndices,int *resultIndices,int matrixCount)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  double **ppdVar4;
  int i;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  double *pdVar8;
  uint uVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  ulong uVar13;
  double *pdVar14;
  
  uVar1 = this->kCategoryCount;
  ppdVar4 = this->gTransitionMatrices;
  uVar7 = 0;
  while( true ) {
    if (uVar7 == (uint)(~(matrixCount >> 0x1f) & matrixCount)) {
      return 0;
    }
    if (inputIndices[uVar7] == resultIndices[uVar7]) break;
    uVar2 = this->kStateCount;
    pdVar11 = ppdVar4[resultIndices[uVar7]];
    pdVar8 = ppdVar4[inputIndices[uVar7]];
    iVar6 = this->kTransPaddedStateCount * uVar2;
    for (uVar9 = 0; uVar9 != (~((int)uVar1 >> 0x1f) & uVar1); uVar9 = uVar9 + 1) {
      lVar10 = 0;
      pdVar12 = pdVar11;
      for (uVar5 = 0; uVar5 != (~((int)uVar2 >> 0x1f) & uVar2); uVar5 = uVar5 + 1) {
        iVar3 = this->kTransPaddedStateCount;
        pdVar14 = pdVar12;
        for (uVar13 = 0; uVar2 != uVar13; uVar13 = uVar13 + 1) {
          *pdVar14 = *(double *)((long)pdVar8 + uVar13 * 8 + lVar10 * iVar3);
          pdVar14 = pdVar14 + iVar3;
        }
        lVar10 = lVar10 + 8;
        pdVar12 = pdVar12 + 1;
      }
      pdVar8 = pdVar8 + iVar6;
      pdVar11 = pdVar11 + iVar6;
    }
    uVar7 = uVar7 + 1;
  }
  return -5;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::transposeTransitionMatrices(
        const int* inputIndices,
        const int* resultIndices,
        int matrixCount) {

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Entering BeagleCPUImpl::transposeTransitionMatrices \n");
#endif

    int returnCode = BEAGLE_SUCCESS;

    for (int u = 0; u < matrixCount; u++) {

        if (inputIndices[u] == resultIndices[u]) {

#ifdef BEAGLE_DEBUG_FLOW
            fprintf(stderr, "In-place transpose is not allowed.\n");
#endif

            returnCode = BEAGLE_ERROR_OUT_OF_RANGE;
            break;

        }

        REALTYPE* A = gTransitionMatrices[inputIndices[u]];
        REALTYPE* C = gTransitionMatrices[resultIndices[u]];

        for (int l = 0; l < kCategoryCount; l++) {

            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {

                    C[kTransPaddedStateCount * j + i] = A[kTransPaddedStateCount * i + j];

                }
            }

            A += kStateCount * kTransPaddedStateCount;
            C += kStateCount * kTransPaddedStateCount;
        }
    }

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Leaving BeagleCPUImpl::transposeTransitionMatrices \n");
#endif

    return returnCode;
}